

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_wrapper_test.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  ion_cursor_status_t iVar2;
  ion_err_t iVar3;
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  ion_status_t iVar4;
  ostream *poVar5;
  long *plVar6;
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar7;
  ion_dictionary_t *dictionary;
  string v;
  string u;
  string t;
  string s;
  string w;
  string buf2;
  string buf;
  string buf3;
  char *local_200;
  long local_1f8;
  char local_1f0 [16];
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1e0;
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  undefined1 *local_198;
  long local_190;
  undefined1 local_188 [16];
  undefined1 *local_178;
  long local_170;
  undefined1 local_168 [16];
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  ion_dictionary_t *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this = (Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)operator_new(0x80);
  FlatFile<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  FlatFile((FlatFile<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)this,0,key_type_numeric_signed,4,10,0x1e);
  printf("Insert %d [%s]\n",3,"hello!");
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"hello!","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,local_178,local_178 + local_170);
  local_110._M_dataplus._M_p._0_4_ = 3;
  dictionary = &this->dict;
  iVar4 = dictionary_insert(dictionary,&local_110,local_70);
  this->last_status = iVar4;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get(&local_110,this,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieve key 3 and got back ",0x1c);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      (char *)CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                       local_110._M_dataplus._M_p._0_4_),local_110._M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Updating value of key 3 to hi!",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_198 = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"hi!","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)local_90,local_198,local_198 + local_190);
  local_130._M_dataplus._M_p._0_4_ = 3;
  iVar4 = dictionary_update(dictionary,&local_130,local_90);
  this->last_status = iVar4;
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get(&local_130,this,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieve key 3 after update and got back ",0x29);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      (char *)CONCAT44(local_130._M_dataplus._M_p._4_4_,
                                       local_130._M_dataplus._M_p._0_4_),local_130._M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Delete key 3",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_50._M_dataplus._M_p._0_4_ = 3;
  iVar4 = dictionary_delete(dictionary,&local_50);
  this->last_status = iVar4;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Try and retrieve key 3 after deletion",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get(&local_50,this,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieve key 3 and got back status ",0x23);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)(this->last_status).error);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  printf("Insert %d [%s]\n",3,"test1!");
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"test1!","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)local_b0,local_1b8,local_1b8 + local_1b0);
  local_1d8 = (undefined1 *)CONCAT44(local_1d8._4_4_,3);
  iVar4 = dictionary_insert(dictionary,&local_1d8,local_b0);
  this->last_status = iVar4;
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  printf("Insert %d [%s]\n",3,"test2!");
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"test2!","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)local_d0,local_1d8,local_1d8 + local_1d0);
  local_158 = (undefined1 *)CONCAT44(local_158._4_4_,3);
  iVar4 = dictionary_insert(dictionary,&local_158,local_d0);
  this->last_status = iVar4;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  printf("Insert %d [%s]\n",4,"test3!");
  local_158 = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"test3!","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>((string *)local_f0,local_158,local_158 + local_150);
  local_200 = (char *)CONCAT44(local_200._4_4_,4);
  iVar4 = dictionary_insert(dictionary,&local_200,local_f0);
  this->last_status = iVar4;
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing equality query on key 3: ",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_1e0 = this;
  local_138 = dictionary;
  pCVar7 = Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::equality(this,3);
  while( true ) {
    iVar2 = (*pCVar7->cursor->next)(pCVar7->cursor,&pCVar7->record);
    if ((iVar2 != '\x04') && (iVar2 != '\x02')) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[eq] Got back [",0xf);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(pCVar7->record).key);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    plVar6 = (long *)(pCVar7->record).value;
    lVar1 = *plVar6;
    local_200 = local_1f0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_200,lVar1,plVar6[1] + lVar1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_200,local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (local_200 != local_1f0) {
      operator_delete(local_200);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Cursor(pCVar7);
  operator_delete(pCVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing all records query: ",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  pCVar7 = Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::allRecords(local_1e0);
  while( true ) {
    iVar2 = (*pCVar7->cursor->next)(pCVar7->cursor,&pCVar7->record);
    if ((iVar2 != '\x04') && (iVar2 != '\x02')) break;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[all] Got back [",0x10);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(pCVar7->record).key);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    plVar6 = (long *)(pCVar7->record).value;
    lVar1 = *plVar6;
    local_200 = local_1f0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_200,lVar1,plVar6[1] + lVar1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_200,local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (local_200 != local_1f0) {
      operator_delete(local_200);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Cursor(pCVar7);
  operator_delete(pCVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing range query: 2<=key<=3 ",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  pCVar7 = Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::range(local_1e0,2,3);
  while( true ) {
    iVar2 = (*pCVar7->cursor->next)(pCVar7->cursor,&pCVar7->record);
    if ((iVar2 != '\x04') && (iVar2 != '\x02')) break;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[range] Got back [",0x12);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(pCVar7->record).key);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    plVar6 = (long *)(pCVar7->record).value;
    lVar1 = *plVar6;
    local_200 = local_1f0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_200,lVar1,plVar6[1] + lVar1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_200,local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (local_200 != local_1f0) {
      operator_delete(local_200);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Cursor(pCVar7);
  operator_delete(pCVar7);
  iVar3 = dictionary_delete_dictionary(local_138);
  (local_1e0->last_status).error = iVar3;
  operator_delete(local_1e0);
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_130._M_dataplus._M_p._4_4_,local_130._M_dataplus._M_p._0_4_) !=
      &local_130.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_130._M_dataplus._M_p._4_4_,local_130._M_dataplus._M_p._0_4_));
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_) !=
      &local_110.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_));
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  return 0;
}

Assistant:

int
main(
) {
	/* The following is example test code using int keys and string values */
	Dictionary<int, string> *dict = new FlatFile<int, string>(0, key_type_numeric_signed, sizeof(int), 10, 30);

	printf("Insert %d [%s]\n", 3, "hello!");

	string s = "hello!";

	dict->insert(3, s);

	string buf = dict->get(3);

	cout << "Retrieve key 3 and got back " << buf << endl << endl;

	cout << "Updating value of key 3 to hi!" << endl;

	string t = "hi!";

	dict->update(3, t);

	string buf2 = dict->get(3);

	cout << "Retrieve key 3 after update and got back " << buf2 << endl << endl;

	cout << "Delete key 3" << endl;
	dict->deleteRecord(3);

	cout << "Try and retrieve key 3 after deletion" << endl;

	string buf3 = dict->get(3);

	cout << "Retrieve key 3 and got back status " << (int) dict->last_status.error << endl << endl;

	printf("Insert %d [%s]\n", 3, "test1!");

	string u = "test1!";

	dict->insert(3, u);

	printf("Insert %d [%s]\n", 3, "test2!");

	string v = "test2!";

	dict->insert(3, v);

	printf("Insert %d [%s]\n", 4, "test3!");

	string w = "test3!";

	dict->insert(4, w);

	cout << "Testing equality query on key 3: " << endl;
	Cursor<int, string> *eq_cursor = dict->equality(3);

	while (eq_cursor->next()) {
		cout << "[eq] Got back [" << eq_cursor->getKey() << ", " << eq_cursor->getValue() << "]" << endl;
	}

	cout << endl;

	delete eq_cursor;

	cout << "Testing all records query: " << endl;
	Cursor<int, string> *all_cursor = dict->allRecords();

	while (all_cursor->next()) {
		cout << "[all] Got back [" << all_cursor->getKey() << ", " << all_cursor->getValue() << "]" << endl;
	}

	cout << endl;

	delete all_cursor;

	cout << "Testing range query: 2<=key<=3 " << endl;
	Cursor<int, string> *range_cursor = dict->range(2, 3);

	while (range_cursor->next()) {
		cout << "[range] Got back [" << range_cursor->getKey() << ", " << range_cursor->getValue() << "]" << endl;
	}

	cout << endl;

	delete range_cursor;

	delete dict;
}